

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationData::addLowScriptRange
          (CollationData *this,uint8_t *table,int32_t index,int32_t lowStart)

{
  ushort uVar1;
  int32_t limit;
  int32_t start;
  int32_t lowStart_local;
  int32_t index_local;
  uint8_t *table_local;
  CollationData *this_local;
  
  uVar1 = this->scriptStarts[index];
  limit = lowStart;
  if ((uVar1 & 0xff) < (lowStart & 0xffU)) {
    limit = lowStart + 0x100;
  }
  table[index] = (uint8_t)((uint)limit >> 8);
  return (limit & 0xff00U) + ((this->scriptStarts[index + 1] & 0xff00) - (uVar1 & 0xff00)) |
         this->scriptStarts[index + 1] & 0xff;
}

Assistant:

int32_t
CollationData::addLowScriptRange(uint8_t table[], int32_t index, int32_t lowStart) const {
    int32_t start = scriptStarts[index];
    if((start & 0xff) < (lowStart & 0xff)) {
        lowStart += 0x100;
    }
    table[index] = (uint8_t)(lowStart >> 8);
    int32_t limit = scriptStarts[index + 1];
    lowStart = ((lowStart & 0xff00) + ((limit & 0xff00) - (start & 0xff00))) | (limit & 0xff);
    return lowStart;
}